

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O0

QDataStream * operator>>(QDataStream *ds,QLocale *l)

{
  long lVar1;
  QDataStream *in_RDI;
  long in_FS_OFFSET;
  QString s;
  QLocale *in_stack_ffffffffffffff88;
  QLocale *in_stack_ffffffffffffff90;
  QString *in_stack_ffffffffffffff98;
  QLocale *in_stack_ffffffffffffffa0;
  QString *str;
  QDataStream *in;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  in = (QDataStream *)&DAT_aaaaaaaaaaaaaaaa;
  str = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  QString::QString((QString *)0x4c864a);
  operator>>(in,str);
  QLocale::QLocale(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  QLocale::operator=(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  QLocale::~QLocale((QLocale *)0x4c868a);
  QString::~QString((QString *)0x4c869e);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QDataStream &operator>>(QDataStream &ds, QLocale &l)
{
    QString s;
    ds >> s;
    l = QLocale(s);
    return ds;
}